

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

int t_pool_flush(t_pool *p)

{
  bool bVar1;
  int local_14;
  int i;
  t_pool *p_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&p->pool_m);
  for (local_14 = 0; local_14 < p->tsize; local_14 = local_14 + 1) {
    if (p->t_stack[local_14] != 0) {
      pthread_cond_signal((pthread_cond_t *)&p->t[local_14].pending_c);
    }
  }
  while( true ) {
    bVar1 = true;
    if (p->njobs == 0) {
      bVar1 = p->nwaiting != p->tsize;
    }
    if (!bVar1) break;
    pthread_cond_wait((pthread_cond_t *)&p->empty_c,(pthread_mutex_t *)&p->pool_m);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&p->pool_m);
  return 0;
}

Assistant:

int t_pool_flush(t_pool *p) {
    int i;

#ifdef DEBUG
    fprintf(stderr, "Flushing pool %p\n", p);
#endif

    // Drains the queue
    pthread_mutex_lock(&p->pool_m);

    // Wake up everything for the final sprint!
    for (i = 0; i < p->tsize; i++)
	if (p->t_stack[i])
	    pthread_cond_signal(&p->t[i].pending_c);

    while (p->njobs || p->nwaiting != p->tsize)
	pthread_cond_wait(&p->empty_c, &p->pool_m);

    pthread_mutex_unlock(&p->pool_m);

#ifdef DEBUG
    fprintf(stderr, "Flushed complete for pool %p, njobs=%d, nwaiting=%d\n",
	    p, p->njobs, p->nwaiting);
#endif

    return 0;
}